

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

int rw::Engine::close(int __fd)

{
  int iVar1;
  uint i;
  long lVar2;
  
  if ((engine == 0) || (state != 2)) {
    iVar1 = close(__fd);
  }
  else {
    lVar2 = 0;
    (**(code **)(engine + 0x108))(3,0,0);
    do {
      (*DAT_00149de0)(*(undefined8 *)(engine + 0x20 + lVar2 * 8));
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xd);
    ObjPipeline::destroy(*(ObjPipeline **)(engine + 0x110));
    iVar1 = (*DAT_00149de0)(engine);
    engine = 0;
    state = 1;
  }
  return iVar1;
}

Assistant:

void
Engine::close(void)
{
	if(engine == nil || Engine::state != Opened){
		RWERROR((ERR_GENERAL));
		return;
	}

	engine->device.system(DEVICECLOSE, nil, 0);
	for(uint i = 0; i < NUM_PLATFORMS; i++)
		rwFree(rw::engine->driver[i]);
	engine->dummyDefaultPipeline->destroy();
	rwFree(engine);
	engine = nil;
	Engine::state = Initialized;
}